

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_erkstep_io.c
# Opt level: O0

int erkStep_WriteParameters(ARKodeMem ark_mem,FILE *fp)

{
  ARKodeMem in_RSI;
  int retval;
  ARKodeERKStepMem step_mem;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = erkStep_AccessStepMem
                      (in_RSI,in_stack_ffffffffffffffe0,
                       (ARKodeERKStepMem *)
                       CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (local_4 == 0) {
    fprintf((FILE *)in_RSI,"ERKStep time step module parameters:\n");
    fprintf((FILE *)in_RSI,"  Method order %i\n",(ulong)*(uint *)(in_stack_ffffffffffffffe0 + 0x10))
    ;
    fprintf((FILE *)in_RSI,"\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int erkStep_WriteParameters(ARKodeMem ark_mem, FILE* fp)
{
  ARKodeERKStepMem step_mem;
  int retval;

  /* access ARKodeERKStepMem structure */
  retval = erkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* print integrator parameters to file */
  fprintf(fp, "ERKStep time step module parameters:\n");
  fprintf(fp, "  Method order %i\n", step_mem->q);
  fprintf(fp, "\n");

  return (ARK_SUCCESS);
}